

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fShaderStateQueryTests.cpp
# Opt level: O3

int __thiscall
deqp::gles2::Functional::ShaderStateQueryTests::init(ShaderStateQueryTests *this,EVP_PKEY_CTX *ctx)

{
  int extraout_EAX;
  ApiCase *pAVar1;
  
  pAVar1 = (ApiCase *)operator_new(0x98);
  ApiCase::ApiCase(pAVar1,(this->super_TestCaseGroup).m_context,"shader_type","SHADER_TYPE");
  (pAVar1->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__ApiCase_00779de0;
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pAVar1);
  pAVar1 = (ApiCase *)operator_new(0x98);
  ApiCase::ApiCase(pAVar1,(this->super_TestCaseGroup).m_context,"shader_compile_status",
                   "COMPILE_STATUS");
  (pAVar1->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__ApiCase_00779e38;
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pAVar1);
  pAVar1 = (ApiCase *)operator_new(0x98);
  ApiCase::ApiCase(pAVar1,(this->super_TestCaseGroup).m_context,"shader_info_log_length",
                   "INFO_LOG_LENGTH");
  (pAVar1->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__ApiCase_00779e90;
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pAVar1);
  pAVar1 = (ApiCase *)operator_new(0x98);
  ApiCase::ApiCase(pAVar1,(this->super_TestCaseGroup).m_context,"shader_source_length",
                   "SHADER_SOURCE_LENGTH");
  (pAVar1->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__ApiCase_00779ee8;
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pAVar1);
  pAVar1 = (ApiCase *)operator_new(0x98);
  ApiCase::ApiCase(pAVar1,(this->super_TestCaseGroup).m_context,"delete_status","DELETE_STATUS");
  (pAVar1->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__ApiCase_00779f40;
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pAVar1);
  pAVar1 = (ApiCase *)operator_new(0x98);
  ApiCase::ApiCase(pAVar1,(this->super_TestCaseGroup).m_context,"current_vertex_attrib_initial",
                   "CURRENT_VERTEX_ATTRIB");
  (pAVar1->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__ApiCase_00779f98;
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pAVar1);
  pAVar1 = (ApiCase *)operator_new(0x98);
  ApiCase::ApiCase(pAVar1,(this->super_TestCaseGroup).m_context,"current_vertex_attrib_float",
                   "CURRENT_VERTEX_ATTRIB");
  (pAVar1->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__ApiCase_00779ff0;
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pAVar1);
  pAVar1 = (ApiCase *)operator_new(0x98);
  ApiCase::ApiCase(pAVar1,(this->super_TestCaseGroup).m_context,"current_vertex_attrib_float_to_int"
                   ,"CURRENT_VERTEX_ATTRIB");
  (pAVar1->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__ApiCase_0077a048;
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pAVar1);
  pAVar1 = (ApiCase *)operator_new(0x98);
  ApiCase::ApiCase(pAVar1,(this->super_TestCaseGroup).m_context,"program_info_log_length",
                   "INFO_LOG_LENGTH");
  (pAVar1->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__ApiCase_0077a0a0;
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pAVar1);
  pAVar1 = (ApiCase *)operator_new(0x98);
  ApiCase::ApiCase(pAVar1,(this->super_TestCaseGroup).m_context,"program_validate_status",
                   "VALIDATE_STATUS");
  (pAVar1->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__ApiCase_0077a0f8;
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pAVar1);
  pAVar1 = (ApiCase *)operator_new(0x98);
  ApiCase::ApiCase(pAVar1,(this->super_TestCaseGroup).m_context,"program_attached_shaders",
                   "ATTACHED_SHADERS");
  (pAVar1->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__ApiCase_0077a150;
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pAVar1);
  pAVar1 = (ApiCase *)operator_new(0x98);
  ApiCase::ApiCase(pAVar1,(this->super_TestCaseGroup).m_context,"program_active_uniform_name",
                   "ACTIVE_UNIFORMS and ACTIVE_UNIFORM_MAX_LENGTH");
  (pAVar1->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__ApiCase_0077a1a8;
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pAVar1);
  pAVar1 = (ApiCase *)operator_new(0x98);
  ApiCase::ApiCase(pAVar1,(this->super_TestCaseGroup).m_context,"program_active_uniform_types",
                   "UNIFORM_TYPE and UNIFORM_SIZE");
  (pAVar1->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__ApiCase_0077a200;
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pAVar1);
  pAVar1 = (ApiCase *)operator_new(0x98);
  ApiCase::ApiCase(pAVar1,(this->super_TestCaseGroup).m_context,"active_attributes",
                   "ACTIVE_ATTRIBUTES and ACTIVE_ATTRIBUTE_MAX_LENGTH");
  (pAVar1->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__ApiCase_0077a650;
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pAVar1);
  pAVar1 = (ApiCase *)operator_new(0x98);
  ApiCase::ApiCase(pAVar1,(this->super_TestCaseGroup).m_context,"vertex_attrib_size",
                   "VERTEX_ATTRIB_ARRAY_SIZE");
  (pAVar1->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__ApiCase_0077a6a8;
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pAVar1);
  pAVar1 = (ApiCase *)operator_new(0x98);
  ApiCase::ApiCase(pAVar1,(this->super_TestCaseGroup).m_context,"vertex_attrib_type",
                   "VERTEX_ATTRIB_ARRAY_TYPE");
  (pAVar1->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__ApiCase_0077a700;
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pAVar1);
  pAVar1 = (ApiCase *)operator_new(0x98);
  ApiCase::ApiCase(pAVar1,(this->super_TestCaseGroup).m_context,"vertex_attrib_stride",
                   "VERTEX_ATTRIB_ARRAY_STRIDE");
  (pAVar1->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__ApiCase_0077a758;
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pAVar1);
  pAVar1 = (ApiCase *)operator_new(0x98);
  ApiCase::ApiCase(pAVar1,(this->super_TestCaseGroup).m_context,"vertex_attrib_normalized",
                   "VERTEX_ATTRIB_ARRAY_NORMALIZED");
  (pAVar1->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__ApiCase_0077a7b0;
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pAVar1);
  pAVar1 = (ApiCase *)operator_new(0x98);
  ApiCase::ApiCase(pAVar1,(this->super_TestCaseGroup).m_context,"vertex_attrib_array_enabled",
                   "VERTEX_ATTRIB_ARRAY_ENABLED");
  (pAVar1->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__ApiCase_0077a808;
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pAVar1);
  pAVar1 = (ApiCase *)operator_new(0x98);
  ApiCase::ApiCase(pAVar1,(this->super_TestCaseGroup).m_context,"vertex_attrib_array_buffer_binding"
                   ,"VERTEX_ATTRIB_ARRAY_BUFFER_BINDING");
  (pAVar1->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__ApiCase_0077a860;
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pAVar1);
  pAVar1 = (ApiCase *)operator_new(0x98);
  ApiCase::ApiCase(pAVar1,(this->super_TestCaseGroup).m_context,"vertex_attrib_pointerv",
                   "GetVertexAttribPointerv");
  (pAVar1->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__ApiCase_0077a8b8;
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pAVar1);
  pAVar1 = (ApiCase *)operator_new(0x98);
  ApiCase::ApiCase(pAVar1,(this->super_TestCaseGroup).m_context,"uniform_value_float","GetUniform*")
  ;
  (pAVar1->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__ApiCase_0077a910;
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pAVar1);
  pAVar1 = (ApiCase *)operator_new(0x98);
  ApiCase::ApiCase(pAVar1,(this->super_TestCaseGroup).m_context,"uniform_value_int","GetUniform*");
  (pAVar1->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__ApiCase_0077a968;
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pAVar1);
  pAVar1 = (ApiCase *)operator_new(0x98);
  ApiCase::ApiCase(pAVar1,(this->super_TestCaseGroup).m_context,"uniform_value_boolean",
                   "GetUniform*");
  (pAVar1->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__ApiCase_0077a9c0;
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pAVar1);
  pAVar1 = (ApiCase *)operator_new(0x98);
  ApiCase::ApiCase(pAVar1,(this->super_TestCaseGroup).m_context,"uniform_value_sampler",
                   "GetUniform*");
  (pAVar1->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__ApiCase_0077aa18;
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pAVar1);
  pAVar1 = (ApiCase *)operator_new(0x98);
  ApiCase::ApiCase(pAVar1,(this->super_TestCaseGroup).m_context,"uniform_value_array","GetUniform*")
  ;
  (pAVar1->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__ApiCase_0077aa70;
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pAVar1);
  pAVar1 = (ApiCase *)operator_new(0x98);
  ApiCase::ApiCase(pAVar1,(this->super_TestCaseGroup).m_context,"uniform_value_matrix","GetUniform*"
                  );
  (pAVar1->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__ApiCase_0077aac8;
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pAVar1);
  pAVar1 = (ApiCase *)operator_new(0xa0);
  ApiCase::ApiCase(pAVar1,(this->super_TestCaseGroup).m_context,"precision_vertex_lowp_float",
                   "GetShaderPrecisionFormat");
  (pAVar1->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__ApiCase_0077ab20;
  pAVar1[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)0x8df000008b31;
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pAVar1);
  pAVar1 = (ApiCase *)operator_new(0xa0);
  ApiCase::ApiCase(pAVar1,(this->super_TestCaseGroup).m_context,"precision_vertex_mediump_float",
                   "GetShaderPrecisionFormat");
  (pAVar1->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__ApiCase_0077ab20;
  pAVar1[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)0x8df100008b31;
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pAVar1);
  pAVar1 = (ApiCase *)operator_new(0xa0);
  ApiCase::ApiCase(pAVar1,(this->super_TestCaseGroup).m_context,"precision_vertex_highp_float",
                   "GetShaderPrecisionFormat");
  (pAVar1->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__ApiCase_0077ab20;
  pAVar1[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)0x8df200008b31;
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pAVar1);
  pAVar1 = (ApiCase *)operator_new(0xa0);
  ApiCase::ApiCase(pAVar1,(this->super_TestCaseGroup).m_context,"precision_vertex_lowp_int",
                   "GetShaderPrecisionFormat");
  (pAVar1->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__ApiCase_0077ab20;
  pAVar1[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)0x8df300008b31;
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pAVar1);
  pAVar1 = (ApiCase *)operator_new(0xa0);
  ApiCase::ApiCase(pAVar1,(this->super_TestCaseGroup).m_context,"precision_vertex_mediump_int",
                   "GetShaderPrecisionFormat");
  (pAVar1->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__ApiCase_0077ab20;
  pAVar1[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)0x8df400008b31;
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pAVar1);
  pAVar1 = (ApiCase *)operator_new(0xa0);
  ApiCase::ApiCase(pAVar1,(this->super_TestCaseGroup).m_context,"precision_vertex_highp_int",
                   "GetShaderPrecisionFormat");
  (pAVar1->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__ApiCase_0077ab20;
  pAVar1[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)0x8df500008b31;
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pAVar1);
  pAVar1 = (ApiCase *)operator_new(0xa0);
  ApiCase::ApiCase(pAVar1,(this->super_TestCaseGroup).m_context,"precision_fragment_lowp_float",
                   "GetShaderPrecisionFormat");
  (pAVar1->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__ApiCase_0077ab20;
  pAVar1[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)0x8df000008b30;
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pAVar1);
  pAVar1 = (ApiCase *)operator_new(0xa0);
  ApiCase::ApiCase(pAVar1,(this->super_TestCaseGroup).m_context,"precision_fragment_mediump_float",
                   "GetShaderPrecisionFormat");
  (pAVar1->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__ApiCase_0077ab20;
  pAVar1[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)0x8df100008b30;
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pAVar1);
  pAVar1 = (ApiCase *)operator_new(0xa0);
  ApiCase::ApiCase(pAVar1,(this->super_TestCaseGroup).m_context,"precision_fragment_highp_float",
                   "GetShaderPrecisionFormat");
  (pAVar1->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__ApiCase_0077ab20;
  pAVar1[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)0x8df200008b30;
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pAVar1);
  pAVar1 = (ApiCase *)operator_new(0xa0);
  ApiCase::ApiCase(pAVar1,(this->super_TestCaseGroup).m_context,"precision_fragment_lowp_int",
                   "GetShaderPrecisionFormat");
  (pAVar1->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__ApiCase_0077ab20;
  pAVar1[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)0x8df300008b30;
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pAVar1);
  pAVar1 = (ApiCase *)operator_new(0xa0);
  ApiCase::ApiCase(pAVar1,(this->super_TestCaseGroup).m_context,"precision_fragment_mediump_int",
                   "GetShaderPrecisionFormat");
  (pAVar1->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__ApiCase_0077ab20;
  pAVar1[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)0x8df400008b30;
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pAVar1);
  pAVar1 = (ApiCase *)operator_new(0xa0);
  ApiCase::ApiCase(pAVar1,(this->super_TestCaseGroup).m_context,"precision_fragment_highp_int",
                   "GetShaderPrecisionFormat");
  (pAVar1->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__ApiCase_0077ab20;
  pAVar1[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)0x8df500008b30;
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pAVar1);
  return extraout_EAX;
}

Assistant:

void ShaderStateQueryTests::init (void)
{
	// shader
	addChild(new ShaderTypeCase						(m_context, "shader_type",							"SHADER_TYPE"));
	addChild(new ShaderCompileStatusCase			(m_context, "shader_compile_status",				"COMPILE_STATUS"));
	addChild(new ShaderInfoLogCase					(m_context, "shader_info_log_length",				"INFO_LOG_LENGTH"));
	addChild(new ShaderSourceCase					(m_context, "shader_source_length",					"SHADER_SOURCE_LENGTH"));

	// shader and program
	addChild(new DeleteStatusCase					(m_context, "delete_status",						"DELETE_STATUS"));

	// vertex-attrib
	addChild(new CurrentVertexAttribInitialCase		(m_context, "current_vertex_attrib_initial",		"CURRENT_VERTEX_ATTRIB"));
	addChild(new CurrentVertexAttribFloatCase		(m_context, "current_vertex_attrib_float",			"CURRENT_VERTEX_ATTRIB"));
	addChild(new CurrentVertexAttribConversionCase	(m_context, "current_vertex_attrib_float_to_int",	"CURRENT_VERTEX_ATTRIB"));

	// program
	addChild(new ProgramInfoLogCase					(m_context, "program_info_log_length",				"INFO_LOG_LENGTH"));
	addChild(new ProgramValidateStatusCase			(m_context, "program_validate_status",				"VALIDATE_STATUS"));
	addChild(new ProgramAttachedShadersCase			(m_context, "program_attached_shaders",				"ATTACHED_SHADERS"));

	addChild(new ProgramActiveUniformNameCase		(m_context, "program_active_uniform_name",			"ACTIVE_UNIFORMS and ACTIVE_UNIFORM_MAX_LENGTH"));
	addChild(new ProgramUniformCase					(m_context, "program_active_uniform_types",			"UNIFORM_TYPE and UNIFORM_SIZE"));

	// attribute related
	addChild(new ActiveAttributesCase				(m_context, "active_attributes",					"ACTIVE_ATTRIBUTES and ACTIVE_ATTRIBUTE_MAX_LENGTH"));
	addChild(new VertexAttributeSizeCase			(m_context, "vertex_attrib_size",					"VERTEX_ATTRIB_ARRAY_SIZE"));
	addChild(new VertexAttributeTypeCase			(m_context, "vertex_attrib_type",					"VERTEX_ATTRIB_ARRAY_TYPE"));
	addChild(new VertexAttributeStrideCase			(m_context, "vertex_attrib_stride",					"VERTEX_ATTRIB_ARRAY_STRIDE"));
	addChild(new VertexAttributeNormalizedCase		(m_context, "vertex_attrib_normalized",				"VERTEX_ATTRIB_ARRAY_NORMALIZED"));
	addChild(new VertexAttributeEnabledCase			(m_context, "vertex_attrib_array_enabled",			"VERTEX_ATTRIB_ARRAY_ENABLED"));
	addChild(new VertexAttributeBufferBindingCase	(m_context, "vertex_attrib_array_buffer_binding",	"VERTEX_ATTRIB_ARRAY_BUFFER_BINDING"));
	addChild(new VertexAttributePointerCase			(m_context, "vertex_attrib_pointerv",				"GetVertexAttribPointerv"));

	// uniform values
	addChild(new UniformValueFloatCase				(m_context, "uniform_value_float",					"GetUniform*"));
	addChild(new UniformValueIntCase				(m_context, "uniform_value_int",					"GetUniform*"));
	addChild(new UniformValueBooleanCase			(m_context, "uniform_value_boolean",				"GetUniform*"));
	addChild(new UniformValueSamplerCase			(m_context, "uniform_value_sampler",				"GetUniform*"));
	addChild(new UniformValueArrayCase				(m_context, "uniform_value_array",					"GetUniform*"));
	addChild(new UniformValueMatrixCase				(m_context, "uniform_value_matrix",					"GetUniform*"));

	// precision format query
	addChild(new PrecisionFormatCase				(m_context, "precision_vertex_lowp_float",			"GetShaderPrecisionFormat",		GL_VERTEX_SHADER,	GL_LOW_FLOAT));
	addChild(new PrecisionFormatCase				(m_context, "precision_vertex_mediump_float",		"GetShaderPrecisionFormat",		GL_VERTEX_SHADER,	GL_MEDIUM_FLOAT));
	addChild(new PrecisionFormatCase				(m_context, "precision_vertex_highp_float",			"GetShaderPrecisionFormat",		GL_VERTEX_SHADER,	GL_HIGH_FLOAT));
	addChild(new PrecisionFormatCase				(m_context, "precision_vertex_lowp_int",			"GetShaderPrecisionFormat",		GL_VERTEX_SHADER,	GL_LOW_INT));
	addChild(new PrecisionFormatCase				(m_context, "precision_vertex_mediump_int",			"GetShaderPrecisionFormat",		GL_VERTEX_SHADER,	GL_MEDIUM_INT));
	addChild(new PrecisionFormatCase				(m_context, "precision_vertex_highp_int",			"GetShaderPrecisionFormat",		GL_VERTEX_SHADER,	GL_HIGH_INT));
	addChild(new PrecisionFormatCase				(m_context, "precision_fragment_lowp_float",		"GetShaderPrecisionFormat",		GL_FRAGMENT_SHADER,	GL_LOW_FLOAT));
	addChild(new PrecisionFormatCase				(m_context, "precision_fragment_mediump_float",		"GetShaderPrecisionFormat",		GL_FRAGMENT_SHADER,	GL_MEDIUM_FLOAT));
	addChild(new PrecisionFormatCase				(m_context, "precision_fragment_highp_float",		"GetShaderPrecisionFormat",		GL_FRAGMENT_SHADER,	GL_HIGH_FLOAT));
	addChild(new PrecisionFormatCase				(m_context, "precision_fragment_lowp_int",			"GetShaderPrecisionFormat",		GL_FRAGMENT_SHADER,	GL_LOW_INT));
	addChild(new PrecisionFormatCase				(m_context, "precision_fragment_mediump_int",		"GetShaderPrecisionFormat",		GL_FRAGMENT_SHADER,	GL_MEDIUM_INT));
	addChild(new PrecisionFormatCase				(m_context, "precision_fragment_highp_int",			"GetShaderPrecisionFormat",		GL_FRAGMENT_SHADER,	GL_HIGH_INT));
}